

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::String> * __thiscall
kj::anon_unknown_9::DiskHandle::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *__buf;
  Maybe<kj::String> *size;
  Maybe<kj::String> *pMVar5;
  Maybe<kj::String> *extraout_RAX;
  char *ptrCopy;
  char *pcVar6;
  Maybe<kj::String> *elementCount;
  undefined8 *puVar7;
  Fault f;
  Array<char> buf_heap;
  char buf_stack [256];
  String local_188;
  Maybe<kj::String> *local_170;
  char *local_168;
  Maybe<kj::String> *pMStack_160;
  undefined8 *local_158;
  DiskHandle *local_150;
  PathPtr local_148;
  char local_138 [264];
  
  local_148.parts.size_ = path.parts.size_;
  local_148.parts.ptr = path.parts.ptr;
  elementCount = (Maybe<kj::String> *)0x100;
  local_170 = __return_storage_ptr__;
  local_150 = this;
  do {
    if (elementCount < (Maybe<kj::String> *)0x101) {
      local_168 = (char *)0x0;
      pMStack_160 = (Maybe<kj::String> *)0x0;
      local_158 = (undefined8 *)0x0;
      puVar7 = (undefined8 *)0x0;
      __buf = local_138;
    }
    else {
      __buf = (char *)kj::_::HeapArrayDisposer::allocateImpl
                                (1,(size_t)elementCount,(size_t)elementCount,
                                 (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      puVar7 = &kj::_::HeapArrayDisposer::instance;
      local_158 = &kj::_::HeapArrayDisposer::instance;
      local_168 = __buf;
      pMStack_160 = elementCount;
    }
    pcVar4 = local_168;
    iVar1 = (local_150->fd).fd;
    PathPtr::toString(&local_188,&local_148,false);
    pcVar6 = "";
    if (local_188.content.size_ != 0) {
      pcVar6 = local_188.content.ptr;
    }
    size = (Maybe<kj::String> *)readlinkat(iVar1,pcVar6,__buf,(size_t)elementCount);
    sVar3 = local_188.content.size_;
    pcVar6 = local_188.content.ptr;
    pMVar5 = size;
    if (local_188.content.ptr != (char *)0x0) {
      local_188.content.ptr = (char *)0x0;
      local_188.content.size_ = 0;
      pMVar5 = (Maybe<kj::String> *)
               (*(code *)**(undefined8 **)&(local_188.content.disposer)->_vptr_ArrayDisposer)
                         (local_188.content.disposer,pcVar6,1,sVar3,sVar3,0);
    }
    if ((long)size < 0) {
      pMVar5 = (Maybe<kj::String> *)__errno_location();
      iVar1 = *(int *)&pMVar5->ptr;
      if (iVar1 < 0x14) {
        if (iVar1 == 2) {
LAB_0046f86a:
          (local_170->ptr).isSet = false;
          pMVar5 = local_170;
          goto LAB_0046f8b4;
        }
        bVar2 = true;
        if (iVar1 == 4) goto LAB_0046f8b6;
      }
      else if ((iVar1 == 0x14) || (iVar1 == 0x16)) goto LAB_0046f86a;
      kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                ((Fault *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x33a,iVar1,"readlinkat(fd, path)","path",&local_148);
      (local_170->ptr).isSet = false;
      kj::_::Debug::Fault::~Fault((Fault *)&local_188);
      pMVar5 = extraout_RAX;
LAB_0046f8b4:
      bVar2 = false;
    }
    else {
      if (size < elementCount) {
        heapString(&local_188,__buf,(size_t)size);
        (local_170->ptr).isSet = true;
        (local_170->ptr).field_1.value.content.ptr = local_188.content.ptr;
        (local_170->ptr).field_1.value.content.size_ = local_188.content.size_;
        (local_170->ptr).field_1.value.content.disposer = local_188.content.disposer;
        pMVar5 = (Maybe<kj::String> *)local_188.content.disposer;
        goto LAB_0046f8b4;
      }
      elementCount = (Maybe<kj::String> *)((long)elementCount * 2);
      bVar2 = true;
    }
LAB_0046f8b6:
    if (pcVar4 != (char *)0x0) {
      local_168 = (char *)0x0;
      pMStack_160 = (Maybe<kj::String> *)0x0;
      pMVar5 = (Maybe<kj::String> *)(**(code **)*puVar7)(puVar7,pcVar4,1);
    }
    if (!bVar2) {
      return pMVar5;
    }
  } while( true );
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const {
    size_t trySize = 256;
    for (;;) {
      KJ_STACK_ARRAY(char, buf, trySize, 256, 4096);
      ssize_t n = readlinkat(fd, path.toString().cStr(), buf.begin(), buf.size());
      if (n < 0) {
        int error = errno;
        switch (error) {
          case EINTR:
            continue;
          case ENOENT:
          case ENOTDIR:
          case EINVAL:    // not a link
            return kj::none;
          default:
            KJ_FAIL_SYSCALL("readlinkat(fd, path)", error, path) { return kj::none; }
        }
      }

      if (n >= buf.size()) {
        // Didn't give it enough space. Better retry with a bigger buffer.
        trySize *= 2;
        continue;
      }

      return heapString(buf.begin(), n);
    }
  }